

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

FieldDef * __thiscall
flatbuffers::Parser::AddField(Parser *this,StructDef *struct_def,string *name,Type *type)

{
  _Rb_tree_header *p_Var1;
  pointer ppFVar2;
  StructDef *pSVar3;
  BaseType BVar4;
  bool bVar5;
  FieldDef *e;
  size_t sVar6;
  undefined8 extraout_RAX;
  ulong uVar7;
  size_t sVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  e = (FieldDef *)operator_new(0xe0);
  (e->super_Definition).name._M_dataplus._M_p = (pointer)&(e->super_Definition).name.field_2;
  (e->super_Definition).name._M_string_length = 0;
  (e->super_Definition).name.field_2._M_local_buf[0] = '\0';
  (e->super_Definition).doc_comment._M_dataplus._M_p =
       (pointer)&(e->super_Definition).doc_comment.field_2;
  (e->super_Definition).doc_comment._M_string_length = 0;
  (e->super_Definition).doc_comment.field_2._M_local_buf[0] = '\0';
  p_Var1 = &(e->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header;
  (e->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  *(_Base_ptr *)
   ((long)&(e->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header._M_header + 8) =
       (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(e->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header._M_header + 0x10
   ) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(e->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header._M_header + 0x18
   ) = p_Var1;
  (e->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (e->super_Definition).attributes.vec.
  super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (e->super_Definition).attributes.vec.
  super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (e->super_Definition).attributes.vec.
  super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (e->super_Definition).generated = false;
  (e->value).type.base_type = BASE_TYPE_NONE;
  (e->value).type.element = BASE_TYPE_NONE;
  (e->value).type.struct_def = (StructDef *)0x0;
  (e->value).type.enum_def = (EnumDef *)0x0;
  (e->value).constant._M_dataplus._M_p = (pointer)&(e->value).constant.field_2;
  *(undefined2 *)&(e->value).constant.field_2 = 0x30;
  (e->value).constant._M_string_length = 1;
  (e->value).offset = -1;
  e->deprecated = false;
  e->padding = 0;
  (e->value).offset =
       ((uint)(*(int *)&(struct_def->fields).vec.
                        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
              *(int *)&(struct_def->fields).vec.
                       super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 2) + 4 & 0xfffe;
  std::__cxx11::string::_M_assign((string *)e);
  (e->value).type.enum_def = type->enum_def;
  BVar4 = type->element;
  pSVar3 = type->struct_def;
  (e->value).type.base_type = type->base_type;
  (e->value).type.element = BVar4;
  (e->value).type.struct_def = pSVar3;
  if (struct_def->fixed == true) {
    uVar7 = (ulong)type->base_type;
    if ((uVar7 == 0xf) && (type->struct_def->fixed == true)) {
      sVar6 = type->struct_def->bytesize;
    }
    else {
      sVar6 = (size_t)(char)kTypeSizes[uVar7];
    }
    if ((type->base_type == BASE_TYPE_STRUCT) && (type->struct_def->fixed == true)) {
      sVar8 = type->struct_def->minalign;
    }
    else {
      sVar8 = (size_t)(char)kTypeSizes[uVar7];
    }
    uVar7 = struct_def->minalign;
    if (struct_def->minalign <= sVar8) {
      uVar7 = sVar8;
    }
    ppFVar2 = (struct_def->fields).vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    struct_def->minalign = uVar7;
    uVar7 = sVar8 - 1 & -struct_def->bytesize;
    sVar8 = struct_def->bytesize + uVar7;
    struct_def->bytesize = sVar8;
    if (ppFVar2 !=
        (struct_def->fields).vec.
        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      ppFVar2[-1]->padding = uVar7;
    }
    (e->value).offset = (int)sVar8;
    struct_def->bytesize = sVar6 + sVar8;
  }
  bVar5 = SymbolTable<flatbuffers::FieldDef>::Add(&struct_def->fields,name,e);
  if (!bVar5) {
    return e;
  }
  std::operator+(&local_48,"field already exists: ",name);
  Error(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

FieldDef &Parser::AddField(StructDef &struct_def,
                           const std::string &name,
                           const Type &type) {
  auto &field = *new FieldDef();
  field.value.offset =
    FieldIndexToOffset(static_cast<voffset_t>(struct_def.fields.vec.size()));
  field.name = name;
  field.value.type = type;
  if (struct_def.fixed) {  // statically compute the field offset
    auto size = InlineSize(type);
    auto alignment = InlineAlignment(type);
    // structs_ need to have a predictable format, so we need to align to
    // the largest scalar
    struct_def.minalign = std::max(struct_def.minalign, alignment);
    struct_def.PadLastField(alignment);
    field.value.offset = static_cast<uoffset_t>(struct_def.bytesize);
    struct_def.bytesize += size;
  }
  if (struct_def.fields.Add(name, &field))
    Error("field already exists: " + name);
  return field;
}